

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepTiledOutputFile.cpp
# Opt level: O2

void __thiscall
Imf_2_5::DeepTiledOutputFile::writeTiles
          (DeepTiledOutputFile *this,int dx1,int dx2,int dy1,int dy2,int lx,int ly)

{
  TileMap *this_00;
  _Rb_tree_header *__x;
  size_t *psVar1;
  Data *pDVar2;
  pointer ppTVar3;
  pointer ppTVar4;
  TileBuffer *pTVar5;
  char *pixelData;
  Compressor *pixelDataSize;
  Int64 unpackedDataSize;
  char *sampleCountTableData;
  Int64 sampleCountTableSize;
  BufferedTile *this_01;
  int dx;
  bool bVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  long lVar10;
  TileBufferTask *pTVar11;
  Int64 *pIVar12;
  iterator iVar13;
  iterator iVar14;
  void *pvVar15;
  _Base_ptr p_Var16;
  iterator iVar17;
  _Rb_tree_node_base *p_Var18;
  ostream *poVar19;
  ArgExc *pAVar20;
  IoExc *this_02;
  int iVar21;
  int iVar22;
  ulong uVar23;
  TileCoord *pTVar24;
  _Base_ptr *pp_Var25;
  long lVar26;
  TileCoord *__y;
  TileCoord *__y_00;
  TileCoord *__y_01;
  TileCoord *extraout_RDX;
  TileCoord *extraout_RDX_00;
  TileCoord *extraout_RDX_01;
  TileCoord *extraout_RDX_02;
  TileCoord *extraout_RDX_03;
  TileCoord *extraout_RDX_04;
  long lVar27;
  iterator iVar28;
  string *psVar29;
  uint uVar30;
  uint number;
  string *psVar31;
  ulong uVar32;
  uint number_00;
  _Base_ptr p_Var33;
  iterator iVar34;
  _Rb_tree_node_base *__x_00;
  ulong __n;
  iterator iVar35;
  TileCoord TVar36;
  undefined1 auVar37 [16];
  int local_3ec;
  char *local_3e8;
  int local_3c4;
  TaskGroup taskGroup;
  TileCoord currentTile;
  stringstream _iex_throw_s;
  ostream local_330 [376];
  stringstream _iex_replace_s;
  
  __iex_replace_s = this->_data->_streamData;
  std::mutex::lock(&__iex_replace_s->super_Mutex);
  pDVar2 = this->_data;
  if ((pDVar2->slices).
      super__Vector_base<Imf_2_5::(anonymous_namespace)::TOutSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TOutSliceInfo_*>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      (pDVar2->slices).
      super__Vector_base<Imf_2_5::(anonymous_namespace)::TOutSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TOutSliceInfo_*>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    local_3e8 = "No frame buffer specified as pixel data source.";
  }
  else {
    bVar6 = isValidTile(this,dx1,dy1,lx,ly);
    local_3e8 = "Tile coordinates are invalid.";
    if ((bVar6) && (bVar6 = isValidTile(this,dx2,dy2,lx,ly), bVar6)) {
      bVar6 = isValidLevel(this,lx,ly);
      if (!bVar6) {
        iex_debugTrap();
        std::__cxx11::stringstream::stringstream((stringstream *)&_iex_throw_s);
        poVar19 = std::operator<<(local_330,"Level coordinate (");
        poVar19 = (ostream *)std::ostream::operator<<(poVar19,lx);
        poVar19 = std::operator<<(poVar19,", ");
        poVar19 = (ostream *)std::ostream::operator<<(poVar19,ly);
        std::operator<<(poVar19,") is invalid.");
        pAVar20 = (ArgExc *)__cxa_allocate_exception(0x48);
        Iex_2_5::ArgExc::ArgExc(pAVar20,(stringstream *)&_iex_throw_s);
        __cxa_throw(pAVar20,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
      }
      iVar7 = dx2;
      if (dx2 < dx1) {
        iVar7 = dx1;
      }
      lVar10 = (long)dx2;
      if (dx1 < dx2) {
        dx2 = dx1;
      }
      iVar8 = dy2;
      if (dy1 < dy2) {
        iVar8 = dy1;
      }
      lVar26 = (long)dy2;
      if (dy2 < dy1) {
        dy2 = dy1;
      }
      bVar6 = pDVar2->lineOrder != DECREASING_Y;
      local_3ec = dy2;
      if (bVar6) {
        local_3ec = iVar8;
      }
      lVar10 = dx1 - lVar10;
      lVar27 = -lVar10;
      if (0 < lVar10) {
        lVar27 = lVar10;
      }
      lVar26 = dy1 - lVar26;
      lVar10 = -lVar26;
      if (0 < lVar26) {
        lVar10 = lVar26;
      }
      ppTVar3 = (pDVar2->tileBuffers).
                super__Vector_base<Imf_2_5::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TileBuffer_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      ppTVar4 = (pDVar2->tileBuffers).
                super__Vector_base<Imf_2_5::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TileBuffer_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      IlmThread_2_5::TaskGroup::TaskGroup(&taskGroup);
      iVar8 = (uint)bVar6 * 2 + -1;
      uVar30 = ((int)lVar10 + 1) * ((int)lVar27 + 1);
      number_00 = (uint)((ulong)((long)ppTVar3 - (long)ppTVar4) >> 3);
      if ((int)uVar30 < (int)number_00) {
        number_00 = uVar30;
      }
      if ((int)number_00 < 1) {
        number_00 = 0;
      }
      local_3c4 = local_3ec;
      dx = dx2;
      for (number = 0; number_00 != number; number = number + 1) {
        pTVar11 = (TileBufferTask *)operator_new(0x20);
        anon_unknown_8::TileBufferTask::TileBufferTask
                  (pTVar11,&taskGroup,this->_data,number,dx,local_3c4,lx,ly);
        IlmThread_2_5::ThreadPool::addGlobalTask((Task *)pTVar11);
        iVar9 = dx + 1;
        bVar6 = dx < iVar7;
        iVar21 = iVar8;
        dx = dx2;
        if (bVar6) {
          iVar21 = 0;
          dx = iVar9;
        }
        local_3c4 = local_3c4 + iVar21;
      }
      uVar23 = 0;
      if (0 < (int)uVar30) {
        uVar23 = (ulong)uVar30;
      }
      uVar32 = 0;
      iVar21 = dx2;
      do {
        if (uVar32 == uVar23) {
          IlmThread_2_5::TaskGroup::~TaskGroup(&taskGroup);
          ppTVar3 = (this->_data->tileBuffers).
                    super__Vector_base<Imf_2_5::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TileBuffer_*>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          ppTVar4 = (this->_data->tileBuffers).
                    super__Vector_base<Imf_2_5::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TileBuffer_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          psVar29 = (string *)0x0;
          for (lVar10 = 0; (long)ppTVar4 - (long)ppTVar3 >> 3 != lVar10; lVar10 = lVar10 + 1) {
            pTVar5 = ppTVar3[lVar10];
            psVar31 = (string *)&pTVar5->field_0x70;
            if (psVar29 != (string *)0x0) {
              psVar31 = psVar29;
            }
            if (pTVar5->field_0x68 != '\0') {
              psVar29 = psVar31;
            }
            pTVar5->field_0x68 = 0;
          }
          if (psVar29 == (string *)0x0) {
            IlmThread_2_5::Lock::~Lock((Lock *)&_iex_replace_s);
            return;
          }
          this_02 = (IoExc *)__cxa_allocate_exception(0x48);
          Iex_2_5::IoExc::IoExc(this_02,psVar29);
          __cxa_throw(this_02,&Iex_2_5::IoExc::typeinfo,Iex_2_5::IoExc::~IoExc);
        }
        ppTVar3 = (this->_data->tileBuffers).
                  super__Vector_base<Imf_2_5::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TileBuffer_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pTVar5 = ppTVar3[uVar32 % (ulong)((long)(this->_data->tileBuffers).
                                                super__Vector_base<Imf_2_5::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TileBuffer_*>_>
                                                ._M_impl.super__Vector_impl_data._M_finish -
                                          (long)ppTVar3 >> 3)];
        IlmThread_2_5::Semaphore::wait();
        pDVar2 = this->_data;
        pixelData = *(char **)&pTVar5->dataSize;
        pixelDataSize = pTVar5->compressor;
        unpackedDataSize._0_4_ = pTVar5->format;
        unpackedDataSize._4_4_ = pTVar5->dx;
        sampleCountTableData = (char *)(pTVar5->exception)._M_string_length;
        sampleCountTableSize = (pTVar5->exception).field_2._M_allocated_capacity;
        pIVar12 = TileOffsets::operator()(&pDVar2->tileOffsets,iVar21,local_3ec,lx,ly);
        if (*pIVar12 != 0) {
          iex_debugTrap();
          std::__cxx11::stringstream::stringstream((stringstream *)&_iex_throw_s);
          poVar19 = std::operator<<(local_330,"Attempt to write tile (");
          poVar19 = (ostream *)std::ostream::operator<<(poVar19,iVar21);
          poVar19 = std::operator<<(poVar19,", ");
          poVar19 = (ostream *)std::ostream::operator<<(poVar19,local_3ec);
          poVar19 = std::operator<<(poVar19,", ");
          poVar19 = (ostream *)std::ostream::operator<<(poVar19,lx);
          poVar19 = std::operator<<(poVar19,", ");
          poVar19 = (ostream *)std::ostream::operator<<(poVar19,ly);
          std::operator<<(poVar19,") more than once.");
          pAVar20 = (ArgExc *)__cxa_allocate_exception(0x48);
          Iex_2_5::ArgExc::ArgExc(pAVar20,(stringstream *)&_iex_throw_s);
          __cxa_throw(pAVar20,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
        }
        if (pDVar2->lineOrder == RANDOM_Y) {
          anon_unknown_8::writeTileData
                    (pDVar2,iVar21,local_3ec,lx,ly,pixelData,(Int64)pixelDataSize,unpackedDataSize,
                     sampleCountTableData,sampleCountTableSize);
        }
        else {
          currentTile.dy = local_3ec;
          currentTile.ly = ly;
          this_00 = &pDVar2->tileMap;
          currentTile.dx = iVar21;
          currentTile.lx = lx;
          iVar13 = std::
                   map<Imf_2_5::(anonymous_namespace)::TileCoord,_Imf_2_5::(anonymous_namespace)::BufferedTile_*,_std::less<Imf_2_5::(anonymous_namespace)::TileCoord>,_std::allocator<std::pair<const_Imf_2_5::(anonymous_namespace)::TileCoord,_Imf_2_5::(anonymous_namespace)::BufferedTile_*>_>_>
                   ::find(this_00,&currentTile);
          __x = &(pDVar2->tileMap)._M_t._M_impl.super__Rb_tree_header;
          if ((_Rb_tree_header *)iVar13._M_node != __x) {
            iex_debugTrap();
            std::__cxx11::stringstream::stringstream((stringstream *)&_iex_throw_s);
            poVar19 = std::operator<<(local_330,"Attempt to write tile (");
            poVar19 = (ostream *)std::ostream::operator<<(poVar19,iVar21);
            poVar19 = std::operator<<(poVar19,", ");
            poVar19 = (ostream *)std::ostream::operator<<(poVar19,local_3ec);
            poVar19 = std::operator<<(poVar19,", ");
            poVar19 = (ostream *)std::ostream::operator<<(poVar19,lx);
            poVar19 = std::operator<<(poVar19,", ");
            poVar19 = (ostream *)std::ostream::operator<<(poVar19,ly);
            std::operator<<(poVar19,") more than once.");
            pAVar20 = (ArgExc *)__cxa_allocate_exception(0x48);
            Iex_2_5::ArgExc::ArgExc(pAVar20,(stringstream *)&_iex_throw_s);
            __cxa_throw(pAVar20,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
          }
          pTVar24 = (TileCoord *)__x;
          if (((((pDVar2->nextTileToWrite).lx == lx) && ((pDVar2->nextTileToWrite).ly == ly)) &&
              (pTVar24 = &pDVar2->nextTileToWrite, pTVar24->dx == iVar21)) &&
             ((pDVar2->nextTileToWrite).dy == local_3ec)) {
            anon_unknown_8::writeTileData
                      (pDVar2,iVar21,local_3ec,lx,ly,pixelData,(Int64)pixelDataSize,unpackedDataSize
                       ,sampleCountTableData,sampleCountTableSize);
            TVar36 = Data::nextTileCoord(pDVar2,pTVar24);
            pDVar2->nextTileToWrite = TVar36;
            iVar14 = std::
                     map<Imf_2_5::(anonymous_namespace)::TileCoord,_Imf_2_5::(anonymous_namespace)::BufferedTile_*,_std::less<Imf_2_5::(anonymous_namespace)::TileCoord>,_std::allocator<std::pair<const_Imf_2_5::(anonymous_namespace)::TileCoord,_Imf_2_5::(anonymous_namespace)::BufferedTile_*>_>_>
                     ::find(this_00,pTVar24);
            while (iVar14._M_node != iVar13._M_node) {
              p_Var16 = iVar14._M_node[1]._M_left;
              anon_unknown_8::writeTileData
                        (pDVar2,iVar14._M_node[1]._M_color,*(int *)&iVar14._M_node[1].field_0x4,
                         *(int *)&iVar14._M_node[1]._M_parent,
                         *(int *)((long)&iVar14._M_node[1]._M_parent + 4),*(char **)p_Var16,
                         (Int64)p_Var16->_M_parent,(Int64)p_Var16->_M_left,(char *)p_Var16->_M_right
                         ,*(Int64 *)(p_Var16 + 1));
              this_01 = (BufferedTile *)iVar14._M_node[1]._M_left;
              if (this_01 != (BufferedTile *)0x0) {
                anon_unknown_8::BufferedTile::~BufferedTile(this_01);
              }
              operator_delete(this_01,0x28);
              pvVar15 = (void *)std::_Rb_tree_rebalance_for_erase(iVar14._M_node,&__x->_M_header);
              operator_delete(pvVar15,0x38);
              psVar1 = &(pDVar2->tileMap)._M_t._M_impl.super__Rb_tree_header._M_node_count;
              *psVar1 = *psVar1 - 1;
              TVar36 = Data::nextTileCoord(pDVar2,pTVar24);
              pDVar2->nextTileToWrite = TVar36;
              iVar14 = std::
                       map<Imf_2_5::(anonymous_namespace)::TileCoord,_Imf_2_5::(anonymous_namespace)::BufferedTile_*,_std::less<Imf_2_5::(anonymous_namespace)::TileCoord>,_std::allocator<std::pair<const_Imf_2_5::(anonymous_namespace)::TileCoord,_Imf_2_5::(anonymous_namespace)::BufferedTile_*>_>_>
                       ::find(this_00,pTVar24);
            }
          }
          else {
            p_Var16 = (_Base_ptr)operator_new(0x28);
            *(undefined8 *)p_Var16 = 0;
            p_Var33 = (_Base_ptr)(long)(int)pixelDataSize;
            p_Var16->_M_parent = p_Var33;
            p_Var16->_M_left = (_Base_ptr)(long)(int)(undefined4)unpackedDataSize;
            p_Var16->_M_right = (_Base_ptr)0x0;
            __n = (ulong)(int)sampleCountTableSize;
            *(ulong *)(p_Var16 + 1) = __n;
            pvVar15 = operator_new__((ulong)p_Var33);
            *(void **)p_Var16 = pvVar15;
            memcpy(pvVar15,pixelData,(size_t)p_Var33);
            p_Var33 = (_Base_ptr)operator_new__(__n);
            p_Var16->_M_right = p_Var33;
            memcpy(p_Var33,sampleCountTableData,__n);
            iVar17 = std::
                     _Rb_tree<Imf_2_5::(anonymous_namespace)::TileCoord,_std::pair<const_Imf_2_5::(anonymous_namespace)::TileCoord,_Imf_2_5::(anonymous_namespace)::BufferedTile_*>,_std::_Select1st<std::pair<const_Imf_2_5::(anonymous_namespace)::TileCoord,_Imf_2_5::(anonymous_namespace)::BufferedTile_*>_>,_std::less<Imf_2_5::(anonymous_namespace)::TileCoord>,_std::allocator<std::pair<const_Imf_2_5::(anonymous_namespace)::TileCoord,_Imf_2_5::(anonymous_namespace)::BufferedTile_*>_>_>
                     ::_M_lower_bound((_Rb_tree<Imf_2_5::(anonymous_namespace)::TileCoord,_std::pair<const_Imf_2_5::(anonymous_namespace)::TileCoord,_Imf_2_5::(anonymous_namespace)::BufferedTile_*>,_std::_Select1st<std::pair<const_Imf_2_5::(anonymous_namespace)::TileCoord,_Imf_2_5::(anonymous_namespace)::BufferedTile_*>_>,_std::less<Imf_2_5::(anonymous_namespace)::TileCoord>,_std::allocator<std::pair<const_Imf_2_5::(anonymous_namespace)::TileCoord,_Imf_2_5::(anonymous_namespace)::BufferedTile_*>_>_>
                                       *)(pDVar2->tileMap)._M_t._M_impl.super__Rb_tree_header.
                                         _M_header._M_parent,(_Link_type)__x,(_Base_ptr)&currentTile
                                      ,pTVar24);
            if ((iVar17._M_node == iVar13._M_node) ||
               (bVar6 = std::less<Imf_2_5::(anonymous_namespace)::TileCoord>::operator()
                                  ((less<Imf_2_5::(anonymous_namespace)::TileCoord> *)&currentTile,
                                   (TileCoord *)(iVar17._M_node + 1),__y), bVar6)) {
              p_Var18 = (_Rb_tree_node_base *)operator_new(0x38);
              p_Var18[1]._M_left = (_Base_ptr)0x0;
              __x_00 = p_Var18 + 1;
              *(ulong *)(p_Var18 + 1) = CONCAT44(currentTile.dy,currentTile.dx);
              p_Var18[1]._M_parent = (_Base_ptr)CONCAT44(currentTile.ly,currentTile.lx);
              if (iVar17._M_node == iVar13._M_node) {
                pTVar24 = __y_00;
                if ((pDVar2->tileMap)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
                  iVar35._M_node =
                       (pDVar2->tileMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right;
                  bVar6 = std::less<Imf_2_5::(anonymous_namespace)::TileCoord>::operator()
                                    ((less<Imf_2_5::(anonymous_namespace)::TileCoord> *)
                                     (iVar35._M_node + 1),(TileCoord *)__x_00,__y_00);
                  pTVar24 = extraout_RDX_00;
                  if (bVar6) {
LAB_001d8925:
                    iVar28._M_node = (_Base_ptr)0x0;
                    goto LAB_001d8927;
                  }
                }
LAB_001d88bc:
                pp_Var25 = &(pDVar2->tileMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent
                ;
                bVar6 = true;
                iVar34._M_node = &__x->_M_header;
                while( true ) {
                  auVar37._8_8_ = pTVar24;
                  auVar37._0_8_ = iVar34._M_node;
                  p_Var33 = *pp_Var25;
                  if (p_Var33 == (_Base_ptr)0x0) break;
                  bVar6 = std::less<Imf_2_5::(anonymous_namespace)::TileCoord>::operator()
                                    ((less<Imf_2_5::(anonymous_namespace)::TileCoord> *)__x_00,
                                     (TileCoord *)(p_Var33 + 1),pTVar24);
                  pp_Var25 = &p_Var33->_M_left + !bVar6;
                  pTVar24 = extraout_RDX_03;
                  iVar34._M_node = p_Var33;
                }
                if (bVar6 == false) {
LAB_001d8911:
                  iVar17._M_node = auVar37._0_8_;
                  bVar6 = std::less<Imf_2_5::(anonymous_namespace)::TileCoord>::operator()
                                    ((less<Imf_2_5::(anonymous_namespace)::TileCoord> *)
                                     (iVar17._M_node + 1),(TileCoord *)__x_00,auVar37._8_8_);
                  pTVar24 = extraout_RDX_04;
                  if (!bVar6) goto LAB_001d8977;
                }
                else if (iVar34._M_node !=
                         (pDVar2->tileMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left) {
                  auVar37 = std::_Rb_tree_decrement(iVar34._M_node);
                  goto LAB_001d8911;
                }
                iVar28._M_node = (_Base_ptr)0x0;
              }
              else {
                bVar6 = std::less<Imf_2_5::(anonymous_namespace)::TileCoord>::operator()
                                  ((less<Imf_2_5::(anonymous_namespace)::TileCoord> *)__x_00,
                                   (TileCoord *)(iVar17._M_node + 1),__y_00);
                if (!bVar6) {
                  bVar6 = std::less<Imf_2_5::(anonymous_namespace)::TileCoord>::operator()
                                    ((less<Imf_2_5::(anonymous_namespace)::TileCoord> *)
                                     (iVar17._M_node + 1),(TileCoord *)__x_00,__y_01);
                  if (bVar6) {
                    iVar35._M_node =
                         (pDVar2->tileMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right;
                    pTVar24 = extraout_RDX_01;
                    if (iVar35._M_node == iVar17._M_node) goto LAB_001d8925;
                    auVar37 = std::_Rb_tree_increment(iVar17._M_node);
                    iVar28._M_node = auVar37._0_8_;
                    bVar6 = std::less<Imf_2_5::(anonymous_namespace)::TileCoord>::operator()
                                      ((less<Imf_2_5::(anonymous_namespace)::TileCoord> *)__x_00,
                                       (TileCoord *)(iVar28._M_node + 1),auVar37._8_8_);
                    pTVar24 = extraout_RDX_02;
                    if (!bVar6) goto LAB_001d88bc;
                    iVar34 = iVar17;
                    iVar35._M_node = iVar28._M_node;
                    if ((iVar17._M_node)->_M_right == (_Base_ptr)0x0) goto LAB_001d88b3;
LAB_001d8927:
                    iVar34._M_node = iVar35._M_node;
                    iVar17._M_node = iVar28._M_node;
                    if (iVar34._M_node != (_Base_ptr)0x0) goto LAB_001d8937;
                  }
LAB_001d8977:
                  operator_delete(p_Var18,0x38);
                  goto LAB_001d898e;
                }
                iVar28._M_node =
                     (pDVar2->tileMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
                pTVar24 = __y_01;
                iVar35._M_node = iVar28._M_node;
                if (iVar28._M_node == iVar17._M_node) goto LAB_001d8927;
                auVar37 = std::_Rb_tree_decrement(iVar17._M_node);
                iVar34._M_node = auVar37._0_8_;
                bVar6 = std::less<Imf_2_5::(anonymous_namespace)::TileCoord>::operator()
                                  ((less<Imf_2_5::(anonymous_namespace)::TileCoord> *)
                                   (iVar34._M_node + 1),(TileCoord *)__x_00,auVar37._8_8_);
                pTVar24 = extraout_RDX;
                if (!bVar6) goto LAB_001d88bc;
                iVar28 = iVar17;
                iVar35 = iVar17;
                if ((iVar34._M_node)->_M_right != (_Base_ptr)0x0) goto LAB_001d8927;
LAB_001d88b3:
                iVar28._M_node = (_Base_ptr)0x0;
              }
LAB_001d8937:
              bVar6 = true;
              if (iVar13._M_node != iVar34._M_node && iVar28._M_node == (_Base_ptr)0x0) {
                bVar6 = std::less<Imf_2_5::(anonymous_namespace)::TileCoord>::operator()
                                  ((less<Imf_2_5::(anonymous_namespace)::TileCoord> *)__x_00,
                                   (TileCoord *)(iVar34._M_node + 1),pTVar24);
              }
              std::_Rb_tree_insert_and_rebalance(bVar6,p_Var18,iVar34._M_node,&__x->_M_header);
              psVar1 = &(pDVar2->tileMap)._M_t._M_impl.super__Rb_tree_header._M_node_count;
              *psVar1 = *psVar1 + 1;
              iVar17._M_node = p_Var18;
            }
LAB_001d898e:
            iVar17._M_node[1]._M_left = p_Var16;
          }
        }
        IlmThread_2_5::Semaphore::post();
        if ((int)number_00 < (int)uVar30) {
          pTVar11 = (TileBufferTask *)operator_new(0x20);
          anon_unknown_8::TileBufferTask::TileBufferTask
                    (pTVar11,&taskGroup,this->_data,number_00,dx,local_3c4,lx,ly);
          IlmThread_2_5::ThreadPool::addGlobalTask((Task *)pTVar11);
        }
        uVar32 = uVar32 + 1;
        iVar9 = iVar21 + 1;
        if (iVar7 <= iVar21) {
          iVar9 = dx2;
        }
        iVar22 = iVar8;
        if (iVar21 < iVar7) {
          iVar22 = 0;
        }
        local_3ec = local_3ec + iVar22;
        number_00 = number_00 + 1;
        iVar22 = dx + 1;
        bVar6 = dx < iVar7;
        iVar21 = iVar8;
        dx = dx2;
        if (bVar6) {
          iVar21 = 0;
          dx = iVar22;
        }
        local_3c4 = local_3c4 + iVar21;
        iVar21 = iVar9;
      } while( true );
    }
  }
  pAVar20 = (ArgExc *)__cxa_allocate_exception(0x48);
  Iex_2_5::ArgExc::ArgExc(pAVar20,local_3e8);
  __cxa_throw(pAVar20,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
}

Assistant:

void
DeepTiledOutputFile::writeTiles (int dx1, int dx2, int dy1, int dy2,
                             int lx, int ly)
{
    try
    {
        Lock lock (*_data->_streamData);

        if (_data->slices.size() == 0)
            throw IEX_NAMESPACE::ArgExc ("No frame buffer specified "
                               "as pixel data source.");

        if (!isValidTile (dx1, dy1, lx, ly) || !isValidTile (dx2, dy2, lx, ly))
            throw IEX_NAMESPACE::ArgExc ("Tile coordinates are invalid.");

        if (!isValidLevel (lx, ly))
            THROW (IEX_NAMESPACE::ArgExc,
                   "Level coordinate "
                   "(" << lx << ", " << ly << ") "
                   "is invalid.");
        //
        // Determine the first and last tile coordinates in both dimensions
        // based on the file's lineOrder
        //

        if (dx1 > dx2)
            swap (dx1, dx2);

        if (dy1 > dy2)
            swap (dy1, dy2);

        int dyStart = dy1;
        int dY      = 1;

        if (_data->lineOrder == DECREASING_Y)
        {
            dyStart = dy2;
            dY      = -1;
        }

        int numTiles = (dx2 - dx1 + 1) * (dy2 - dy1 + 1);
        int numTasks = min ((int)_data->tileBuffers.size(), numTiles);

        //
        // Create a task group for all tile buffer tasks.  When the
        // task group goes out of scope, the destructor waits until
        // all tasks are complete.
        //

        {
            TaskGroup taskGroup;

            //
            // Add in the initial compression tasks to the thread pool
            //

            int nextCompBuffer = 0;
            int dxComp         = dx1;
            int dyComp         = dyStart;

            while (nextCompBuffer < numTasks)
            {
                ThreadPool::addGlobalTask (new TileBufferTask (&taskGroup,
                                                               _data,
                                                               nextCompBuffer++,
                                                               dxComp, dyComp,
                                                               lx, ly));
                dxComp++;

                if (dxComp > dx2)
                {
                    dxComp = dx1;
                    dyComp += dY;
                }
            }

            //
            // Write the compressed buffers and add in more compression
            // tasks until done
            //

            int nextWriteBuffer = 0;
            int dxWrite         = dx1;
            int dyWrite         = dyStart;

            while (nextWriteBuffer < numTiles)
            {
                //
                // Wait until the nextWriteBuffer is ready to be written
                //

                TileBuffer* writeBuffer =
                                    _data->getTileBuffer (nextWriteBuffer);

                writeBuffer->wait();

                //
                // Write the tilebuffer
                //

                bufferedTileWrite ( _data, dxWrite, dyWrite, lx, ly,
                                   writeBuffer->dataPtr,
                                   writeBuffer->dataSize,
                                   writeBuffer->uncompressedSize,
                                   writeBuffer->sampleCountTablePtr,
                                   writeBuffer->sampleCountTableSize);

                //
                // Release the lock on nextWriteBuffer
                //

                writeBuffer->post();

                //
                // If there are no more tileBuffers to compress, then
                // only continue to write out remaining tileBuffers,
                // otherwise keep adding compression tasks.
                //

                if (nextCompBuffer < numTiles)
                {
                    //
                    // add nextCompBuffer as a compression Task
                    //

                    ThreadPool::addGlobalTask
                        (new TileBufferTask (&taskGroup,
                                             _data,
                                             nextCompBuffer,
                                             dxComp, dyComp,
                                             lx, ly));
                }

                nextWriteBuffer++;
                dxWrite++;

                if (dxWrite > dx2)
                {
                    dxWrite = dx1;
                    dyWrite += dY;
                }

                nextCompBuffer++;
                dxComp++;

                if (dxComp > dx2)
                {
                    dxComp = dx1;
                    dyComp += dY;
                }
            }

            //
            // finish all tasks
            //
        }

        //
        // Exeption handling:
        //
        // TileBufferTask::execute() may have encountered exceptions, but
        // those exceptions occurred in another thread, not in the thread
        // that is executing this call to TiledOutputFile::writeTiles().
        // TileBufferTask::execute() has caught all exceptions and stored
        // the exceptions' what() strings in the tile buffers.
        // Now we check if any tile buffer contains a stored exception; if
        // this is the case then we re-throw the exception in this thread.
        // (It is possible that multiple tile buffers contain stored
        // exceptions.  We re-throw the first exception we find and
        // ignore all others.)
        //

        const string *exception = 0;

        for (size_t i = 0; i < _data->tileBuffers.size(); ++i)
        {
            TileBuffer *tileBuffer = _data->tileBuffers[i];

            if (tileBuffer->hasException && !exception)
                exception = &tileBuffer->exception;

            tileBuffer->hasException = false;
        }

        if (exception)
            throw IEX_NAMESPACE::IoExc (*exception);
    }
    catch (IEX_NAMESPACE::BaseExc &e)
    {
        REPLACE_EXC (e, "Failed to write pixel data to image "
                     "file \"" << fileName() << "\". " << e.what());
        throw;
    }
}